

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_pack_bool(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  char *__assertion;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type != 2) {
        __assert_fail("nvp->nvp_type == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x16f,
                      "unsigned char *nvpair_pack_bool(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      if (*leftp != 0) {
        *ptr = (uchar)nvp->nvp_data;
        *leftp = *leftp - 1;
        return ptr + 1;
      }
      __assert_fail("*leftp >= sizeof(value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x173,
                    "unsigned char *nvpair_pack_bool(const nvpair_t *, unsigned char *, size_t *)");
    }
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x16e,
                "unsigned char *nvpair_pack_bool(const nvpair_t *, unsigned char *, size_t *)");
}

Assistant:

unsigned char *
nvpair_pack_bool(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	uint8_t value;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BOOL);

	value = (uint8_t)nvp->nvp_data;

	PJDLOG_ASSERT(*leftp >= sizeof(value));
	memcpy(ptr, &value, sizeof(value));
	ptr += sizeof(value);
	*leftp -= sizeof(value);

	return (ptr);
}